

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  string *psVar1;
  OfType OVar2;
  pointer pMVar3;
  ostream *poVar4;
  XmlWriter *this_00;
  pointer pMVar5;
  ScopedElement e;
  string elementName;
  ostringstream oss;
  allocator local_1f9;
  SourceLineInfo local_1f8;
  undefined1 local_1d0 [8];
  pointer local_1c8;
  pointer local_1c0;
  undefined1 local_1b8 [16];
  string local_1a8 [11];
  
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if (((OVar2 & FailureBit) != Ok) &&
     (((stats->assertionResult).m_info.resultDisposition & SuppressFail) == 0)) {
    local_1c8 = (pointer)local_1b8;
    local_1c0 = (pointer)0x0;
    local_1b8[0] = 0;
    if ((((uint)(OVar2 + ~FailureBit) < 2) ||
        (((OVar2 == Unknown || (OVar2 == FailureBit)) || (OVar2 == Exception)))) ||
       (((OVar2 == FatalErrorCondition || (OVar2 == DidntThrowException)) ||
        (OVar2 == ThrewException)))) {
      std::__cxx11::string::assign((char *)&local_1c8);
    }
    this_00 = &this->xml;
    XmlWriter::scopedElement((XmlWriter *)local_1d0,(string *)this_00);
    std::__cxx11::string::string((string *)(local_1b8 + 0x10),"message",&local_1f9);
    std::__cxx11::string::string
              ((string *)&local_1f8,(string *)&(stats->assertionResult).m_resultData);
    XmlWriter::writeAttribute(this_00,(string *)(local_1b8 + 0x10),&local_1f8.file);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)(local_1b8 + 0x10));
    std::__cxx11::string::string((string *)(local_1b8 + 0x10),"type",&local_1f9);
    std::__cxx11::string::string((string *)&local_1f8,(string *)&stats->assertionResult);
    XmlWriter::writeAttribute(this_00,(string *)(local_1b8 + 0x10),&local_1f8.file);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)(local_1b8 + 0x10));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
    psVar1 = &(stats->assertionResult).m_resultData.message;
    std::__cxx11::string::string((string *)&local_1f8,(string *)psVar1);
    std::__cxx11::string::~string((string *)&local_1f8);
    if (local_1f8.file._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_1f8,(string *)psVar1);
      poVar4 = std::operator<<((ostream *)(local_1b8 + 0x10),(string *)&local_1f8);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    pMVar3 = (stats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar5 = (stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar3; pMVar5 = pMVar5 + 1) {
      if (pMVar5->type == Info) {
        poVar4 = std::operator<<((ostream *)(local_1b8 + 0x10),(string *)&pMVar5->message);
        std::operator<<(poVar4,"\n");
      }
    }
    poVar4 = std::operator<<((ostream *)(local_1b8 + 0x10),"at ");
    SourceLineInfo::SourceLineInfo(&local_1f8,&(stats->assertionResult).m_info.lineInfo);
    Catch::operator<<(poVar4,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringbuf::str();
    XmlWriter::writeText(this_00,&local_1f8.file,false);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1d0);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  return;
}

Assistant:

bool AssertionResult::isOk() const {
        return Catch::isOk( m_resultData.resultType ) || shouldSuppressFailure( m_info.resultDisposition );
    }